

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_math_min_max(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int64_t *piVar7;
  ulong uVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 in_XMM3_Qa;
  JSFloat64Union a1;
  double dVar12;
  JSValue JVar13;
  JSValue val;
  JSValue val_00;
  double a;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  if (argc == 0) {
    uVar4 = 0xfff0000000000000;
    if (magic == 0) {
      uVar4 = 0x7ff0000000000000;
    }
    uVar6 = 7;
    uVar8 = uVar4;
  }
  else if ((int)argv->tag == 0) {
    uVar5 = (argv->u).int32;
    if (1 < argc) {
      piVar7 = &argv[1].tag;
      uVar4 = 1;
      do {
        if ((int)*piVar7 != 0) {
          local_48._0_8_ = (double)(int)uVar5;
          local_48._8_8_ = in_XMM3_Qa;
          goto LAB_00168783;
        }
        uVar1 = (((JSValue *)(piVar7 + -1))->u).int32;
        if (magic == 0) {
          if ((int)uVar1 <= (int)uVar5) {
            uVar5 = uVar1;
          }
        }
        else if ((int)uVar5 <= (int)uVar1) {
          uVar5 = uVar1;
        }
        uVar4 = uVar4 + 1;
        piVar7 = piVar7 + 2;
      } while ((uint)argc != uVar4);
    }
    uVar4 = 0;
    uVar6 = 0;
    uVar8 = (ulong)uVar5;
  }
  else {
    val.tag = argv->tag;
    val.u.ptr = (argv->u).ptr;
    iVar3 = JS_ToFloat64(ctx,&local_50,val);
    if (iVar3 == 0) {
      uVar4 = 1;
      local_48._8_8_ = 0;
      local_48._0_8_ = local_50;
LAB_00168783:
      dVar12 = local_48._0_8_;
      if ((int)uVar4 < argc) {
        lVar9 = (ulong)(uint)argc - (uVar4 & 0xffffffff);
        piVar7 = &argv[uVar4 & 0xffffffff].tag;
        do {
          val_00.tag = *piVar7;
          val_00.u.ptr = ((JSValueUnion *)(piVar7 + -1))->ptr;
          iVar3 = JS_ToFloat64(ctx,&local_58,val_00);
          if (iVar3 != 0) goto LAB_00168728;
          dVar12 = local_48._0_8_;
          if (!NAN(dVar12)) {
            uVar11 = (undefined4)((ulong)local_58 >> 0x20);
            if (NAN(local_58)) {
              local_48._8_8_ = 0;
              local_48._0_8_ = local_58;
            }
            else {
              uVar10 = SUB84(local_58,0);
              if (magic == 0) {
                if (dVar12 != 0.0 || local_58 != 0.0) {
                  uVar4 = -(ulong)NAN(dVar12);
                  uVar8 = uVar4 & (ulong)local_58;
                  if (dVar12 <= local_58) {
                    uVar10 = local_48._0_4_;
                    uVar11 = local_48._4_4_;
                  }
                  goto LAB_0016883f;
                }
                auVar2._8_8_ = 0;
                auVar2._0_8_ = local_58;
                local_48 = local_48 | auVar2;
              }
              else if (dVar12 != 0.0 || local_58 != 0.0) {
                uVar4 = -(ulong)NAN(dVar12);
                uVar8 = uVar4 & (ulong)local_58;
                if (local_58 <= dVar12) {
                  uVar10 = local_48._0_4_;
                  uVar11 = local_48._4_4_;
                }
LAB_0016883f:
                local_48._8_8_ = 0;
                local_48._0_8_ = (double)(~uVar4 & CONCAT44(uVar11,uVar10) | uVar8);
              }
              else {
                local_48._0_8_ = (double)((ulong)dVar12 & (ulong)local_58);
                local_48._8_8_ = 0;
              }
            }
          }
          dVar12 = local_48._0_8_;
          piVar7 = piVar7 + 2;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      uVar8 = (ulong)dVar12 & 0xffffffff;
      uVar4 = (ulong)dVar12 & 0xffffffff00000000;
      if (dVar12 == (double)(int)dVar12) {
        uVar8 = (ulong)(uint)(int)dVar12;
        uVar4 = 0;
      }
      uVar6 = 7;
      if (dVar12 == (double)(int)dVar12) {
        uVar6 = 0;
      }
    }
    else {
LAB_00168728:
      uVar4 = 0;
      uVar6 = 6;
      uVar8 = 0;
    }
  }
  JVar13.u.ptr = (void *)(uVar8 & 0xffffffff | uVar4);
  JVar13.tag = uVar6;
  return JVar13;
}

Assistant:

static JSValue js_math_min_max(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int magic)
{
    BOOL is_max = magic;
    double r, a;
    int i;
    uint32_t tag;

    if (unlikely(argc == 0)) {
        return __JS_NewFloat64(ctx, is_max ? -1.0 / 0.0 : 1.0 / 0.0);
    }

    tag = JS_VALUE_GET_TAG(argv[0]);
    if (tag == JS_TAG_INT) {
        int a1, r1 = JS_VALUE_GET_INT(argv[0]);
        for(i = 1; i < argc; i++) {
            tag = JS_VALUE_GET_TAG(argv[i]);
            if (tag != JS_TAG_INT) {
                r = r1;
                goto generic_case;
            }
            a1 = JS_VALUE_GET_INT(argv[i]);
            if (is_max)
                r1 = max_int(r1, a1);
            else
                r1 = min_int(r1, a1);

        }
        return JS_NewInt32(ctx, r1);
    } else {
        if (JS_ToFloat64(ctx, &r, argv[0]))
            return JS_EXCEPTION;
        i = 1;
    generic_case:
        while (i < argc) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isnan(r)) {
                if (isnan(a)) {
                    r = a;
                } else {
                    if (is_max)
                        r = js_fmax(r, a);
                    else
                        r = js_fmin(r, a);
                }
            }
            i++;
        }
        return JS_NewFloat64(ctx, r);
    }
}